

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderBuiltinPrecisionTests.cpp
# Opt level: O3

TestStatus * __thiscall
vkt::shaderexecutor::
BuiltinPrecisionCaseTestInstance<vkt::shaderexecutor::InTypes<tcu::Vector<float,_2>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>,_vkt::shaderexecutor::OutTypes<tcu::Vector<float,_2>,_tcu::Vector<int,_2>_>_>
::iterate(TestStatus *__return_storage_ptr__,
         BuiltinPrecisionCaseTestInstance<vkt::shaderexecutor::InTypes<tcu::Vector<float,_2>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>,_vkt::shaderexecutor::OutTypes<tcu::Vector<float,_2>,_tcu::Vector<int,_2>_>_>
         *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  Precision PVar2;
  Samplings<vkt::shaderexecutor::InTypes<tcu::Vector<float,_2>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
  *this_00;
  size_t sVar3;
  Statement *pSVar4;
  ShaderExecutor *pSVar5;
  Variable<tcu::Vector<float,_2>_> *pVVar6;
  pointer pcVar7;
  Variable<tcu::Vector<int,_2>_> *pVVar8;
  pointer pVVar9;
  bool bVar10;
  bool bVar11;
  int iVar12;
  uint uVar13;
  undefined8 uVar14;
  IVal *pIVar15;
  IVal *pIVar16;
  undefined8 *puVar17;
  Vector<float,_2> *val;
  char *pcVar18;
  long lVar19;
  undefined1 auVar20 [8];
  FloatFormat *pFVar21;
  long lVar22;
  TestStatus *pTVar23;
  IVal in2;
  IVal in1;
  FuncSet funcs;
  IVal in3;
  Outputs<vkt::shaderexecutor::OutTypes<tcu::Vector<float,_2>,_tcu::Vector<int,_2>_>_> outputs;
  IVal in0;
  Environment env;
  void *outputArr [2];
  Inputs<vkt::shaderexecutor::InTypes<tcu::Vector<float,_2>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
  inputs;
  void *inputArr [4];
  FloatFormat highpFmt;
  ResultCollector status;
  ostringstream oss;
  deUint32 in_stack_fffffffffffffa88;
  undefined1 local_568 [8];
  size_type local_560;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_558;
  undefined1 local_548 [48];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_518;
  size_t local_510;
  undefined1 local_508 [8];
  undefined8 uStack_500;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_4f8;
  _Base_ptr local_4e8;
  double dStack_4e0;
  string local_4d8;
  ulong local_4b8;
  FloatFormat *local_4b0;
  TestStatus *local_4a8;
  long local_4a0;
  Outputs<vkt::shaderexecutor::OutTypes<tcu::Vector<float,_2>,_tcu::Vector<int,_2>_>_> local_498;
  undefined1 local_468 [8];
  double dStack_460;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_458;
  _Base_ptr local_448;
  double dStack_440;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>_>
  *local_438;
  undefined4 local_430;
  ios_base local_3f8 [8];
  ios_base local_3f0 [264];
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>_>
  local_2e8;
  pointer local_2b8;
  pointer local_2b0;
  Inputs<vkt::shaderexecutor::InTypes<tcu::Vector<float,_2>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
  local_2a8;
  pointer local_248;
  pointer local_240;
  pointer local_238;
  pointer local_230;
  FloatFormat local_228;
  ResultCollector local_1f8;
  undefined1 local_1a8 [24];
  ulong uStack_190;
  _Base_ptr local_188;
  double dStack_180;
  ios_base local_138 [264];
  
  this_00 = this->m_samplings;
  pFVar21 = &(this->m_caseCtx).floatFormat;
  PVar2 = (this->m_caseCtx).precision;
  sVar3 = (this->m_caseCtx).numRandoms;
  local_4a8 = __return_storage_ptr__;
  iVar12 = tcu::CommandLine::getBaseSeed(((this->m_caseCtx).testContext)->m_cmdLine);
  local_4b0 = pFVar21;
  generateInputs<vkt::shaderexecutor::InTypes<tcu::Vector<float,2>,vkt::shaderexecutor::Void,vkt::shaderexecutor::Void,vkt::shaderexecutor::Void>>
            (&local_2a8,(shaderexecutor *)this_00,
             (Samplings<vkt::shaderexecutor::InTypes<tcu::Vector<float,_2>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
              *)pFVar21,(FloatFormat *)(ulong)PVar2,(Precision)sVar3,(ulong)(iVar12 + 0xdeadbeef),
             in_stack_fffffffffffffa88);
  pVVar9 = local_2a8.in0.
           super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>.
           _M_impl.super__Vector_impl_data._M_start;
  local_510 = (long)local_2a8.in0.
                    super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)local_2a8.in0.
                    super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 3;
  Outputs<vkt::shaderexecutor::OutTypes<tcu::Vector<float,_2>,_tcu::Vector<int,_2>_>_>::Outputs
            (&local_498,local_510);
  local_228.m_maxValue = (this->m_caseCtx).highpFormat.m_maxValue;
  local_228.m_minExp = (this->m_caseCtx).highpFormat.m_minExp;
  local_228.m_maxExp = (this->m_caseCtx).highpFormat.m_maxExp;
  local_228.m_fractionBits = (this->m_caseCtx).highpFormat.m_fractionBits;
  local_228.m_hasSubnormal = (this->m_caseCtx).highpFormat.m_hasSubnormal;
  local_228.m_hasInf = (this->m_caseCtx).highpFormat.m_hasInf;
  local_228.m_hasNaN = (this->m_caseCtx).highpFormat.m_hasNaN;
  local_228.m_exactPrecision = (this->m_caseCtx).highpFormat.m_exactPrecision;
  local_228._25_7_ = *(undefined7 *)&(this->m_caseCtx).highpFormat.field_0x19;
  local_2e8._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_2e8._M_impl.super__Rb_tree_header._M_header;
  local_2e8._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_2e8._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_2e8._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_2e8._M_impl.super__Rb_tree_header._M_header._M_right =
       local_2e8._M_impl.super__Rb_tree_header._M_header._M_left;
  tcu::ResultCollector::ResultCollector(&local_1f8);
  local_518 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)((this->super_TestInstance).m_context)->m_testCtx->m_log;
  local_248 = local_2a8.in0.
              super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>.
              _M_impl.super__Vector_impl_data._M_start;
  local_240 = local_2a8.in1.
              super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
              ._M_impl.super__Vector_impl_data._M_start;
  local_238 = local_2a8.in2.
              super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
              ._M_impl.super__Vector_impl_data._M_start;
  local_230 = local_2a8.in3.
              super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
              ._M_impl.super__Vector_impl_data._M_start;
  local_2b8 = local_498.out0.
              super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>.
              _M_impl.super__Vector_impl_data._M_start;
  local_2b0 = local_498.out1.
              super__Vector_base<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_>._M_impl
              .super__Vector_impl_data._M_start;
  local_468 = (undefined1  [8])local_518;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&dStack_460);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&dStack_460,"Statement: ",0xb);
  std::ostream::_M_insert<bool>(SUB81((ostringstream *)&dStack_460,0));
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_468,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&dStack_460);
  std::ios_base::~ios_base(local_3f0);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  uStack_500 = (double)((ulong)uStack_500._4_4_ << 0x20);
  aStack_4f8._M_allocated_capacity = 0;
  dStack_4e0 = 0.0;
  pSVar4 = (this->m_stmt).super_SharedPtr<const_vkt::shaderexecutor::Statement>.m_ptr;
  aStack_4f8._8_8_ = (_Rb_tree_node_base *)&uStack_500;
  local_4e8 = (_Rb_tree_node_base *)&uStack_500;
  (*pSVar4->_vptr_Statement[4])(pSVar4,local_508);
  if ((_Rb_tree_node_base *)aStack_4f8._8_8_ != (_Rb_tree_node_base *)&uStack_500) {
    uVar14 = aStack_4f8._8_8_;
    do {
      (**(code **)(**(long **)(uVar14 + 0x20) + 0x30))(*(long **)(uVar14 + 0x20),local_1a8);
      uVar14 = std::_Rb_tree_increment((_Rb_tree_node_base *)uVar14);
    } while ((_Rb_tree_node_base *)uVar14 != (_Rb_tree_node_base *)&uStack_500);
  }
  if (dStack_4e0 != 0.0) {
    local_468 = (undefined1  [8])local_518;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&dStack_460);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&dStack_460,"Reference definitions:\n",0x17);
    std::__cxx11::stringbuf::str();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&dStack_460,(char *)local_548._0_8_,local_548._8_8_);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_468,(EndMessageToken *)&tcu::TestLog::EndMessage);
    if ((IVal *)local_548._0_8_ != (IVal *)(local_548 + 0x10)) {
      operator_delete((void *)local_548._0_8_,local_548._16_8_ + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&dStack_460);
    std::ios_base::~ios_base(local_3f0);
  }
  std::
  _Rb_tree<const_vkt::shaderexecutor::FuncBase_*,_const_vkt::shaderexecutor::FuncBase_*,_std::_Identity<const_vkt::shaderexecutor::FuncBase_*>,_std::less<const_vkt::shaderexecutor::FuncBase_*>,_std::allocator<const_vkt::shaderexecutor::FuncBase_*>_>
  ::~_Rb_tree((_Rb_tree<const_vkt::shaderexecutor::FuncBase_*,_const_vkt::shaderexecutor::FuncBase_*,_std::_Identity<const_vkt::shaderexecutor::FuncBase_*>,_std::less<const_vkt::shaderexecutor::FuncBase_*>,_std::allocator<const_vkt::shaderexecutor::FuncBase_*>_>
               *)local_508);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  std::ios_base::~ios_base(local_138);
  pSVar5 = (this->m_executor).
           super_UniqueBase<vkt::shaderexecutor::ShaderExecutor,_de::DefaultDeleter<vkt::shaderexecutor::ShaderExecutor>_>
           .m_data.ptr;
  (*pSVar5->_vptr_ShaderExecutor[2])(pSVar5,local_510,&local_248,&local_2b8,0);
  local_468 = (undefined1  [8])((ulong)local_468 & 0xffffffffffffff00);
  dStack_460 = INFINITY;
  aStack_458._M_allocated_capacity = 0xfff0000000000000;
  aStack_458._8_4_ = aStack_458._8_4_ & 0xffffff00;
  local_448 = (_Base_ptr)0x7ff0000000000000;
  dStack_440 = -INFINITY;
  local_1a8._0_8_ = local_1a8._0_8_ & 0xffffffffffffff00;
  local_1a8._8_8_ = INFINITY;
  local_1a8._16_8_ = (_Base_ptr)0xfff0000000000000;
  uStack_190 = uStack_190 & 0xffffffffffffff00;
  local_188 = (_Base_ptr)0x7ff0000000000000;
  dStack_180 = -INFINITY;
  local_508 = (undefined1  [8])((ulong)local_508 & 0xffffffffffffff00);
  uStack_500 = INFINITY;
  aStack_4f8._M_allocated_capacity = 0xfff0000000000000;
  aStack_4f8._8_8_ = aStack_4f8._8_8_ & 0xffffffffffffff00;
  local_4e8 = (_Base_ptr)0x7ff0000000000000;
  dStack_4e0 = -INFINITY;
  Environment::bind<tcu::Vector<float,2>>
            ((Environment *)&local_2e8,
             (this->m_variables).in0.
             super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Vector<float,_2>_>_>.m_ptr,
             (IVal *)local_468);
  Environment::bind<vkt::shaderexecutor::Void>
            ((Environment *)&local_2e8,
             (this->m_variables).in1.
             super_SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>.m_ptr,
             (IVal *)local_548);
  Environment::bind<vkt::shaderexecutor::Void>
            ((Environment *)&local_2e8,
             (this->m_variables).in2.
             super_SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>.m_ptr,
             (IVal *)local_568);
  Environment::bind<vkt::shaderexecutor::Void>
            ((Environment *)&local_2e8,
             (this->m_variables).in3.
             super_SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>.m_ptr,
             (IVal *)&local_4d8);
  Environment::bind<tcu::Vector<float,2>>
            ((Environment *)&local_2e8,
             (this->m_variables).out0.
             super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Vector<float,_2>_>_>.m_ptr,
             (IVal *)local_1a8);
  Environment::bind<tcu::Vector<int,2>>
            ((Environment *)&local_2e8,
             (this->m_variables).out1.
             super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Vector<int,_2>_>_>.m_ptr,
             (IVal *)local_508);
  if (local_2a8.in0.
      super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>._M_impl.
      super__Vector_impl_data._M_finish == pVVar9) {
LAB_00999ea0:
    local_468 = (undefined1  [8])local_518;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&dStack_460);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&dStack_460,"All ",4);
    pTVar23 = local_4a8;
    std::ostream::_M_insert<unsigned_long>((ulong)&dStack_460);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&dStack_460," inputs passed.",0xf)
    ;
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_468,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&dStack_460);
    std::ios_base::~ios_base(local_3f0);
    local_468 = (undefined1  [8])&aStack_458;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_468,"Pass","");
    pTVar23->m_code = QP_TEST_RESULT_PASS;
    (pTVar23->m_description)._M_dataplus._M_p = (pointer)&(pTVar23->m_description).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&pTVar23->m_description,local_468,
               (char *)((long)local_468 + (long)dStack_460));
    uVar14 = aStack_458._M_allocated_capacity;
    auVar20 = local_468;
    if (local_468 == (undefined1  [8])&aStack_458) goto LAB_0099a087;
  }
  else {
    local_4a0 = local_510 + (local_510 == 0);
    lVar22 = 0;
    local_4b8 = 0;
    pFVar21 = local_4b0;
    do {
      local_1a8._0_8_ = local_1a8._0_8_ & 0xffffffffffffff00;
      local_1a8._8_8_ = INFINITY;
      local_1a8._16_8_ = -INFINITY;
      uStack_190 = uStack_190 & 0xffffffffffffff00;
      local_188 = (_Base_ptr)0x7ff0000000000000;
      dStack_180 = -INFINITY;
      local_508 = (undefined1  [8])((ulong)local_508 & 0xffffffffffffff00);
      uStack_500 = INFINITY;
      aStack_4f8._M_allocated_capacity = 0xfff0000000000000;
      aStack_4f8._8_8_ = aStack_4f8._8_8_ & 0xffffffffffffff00;
      local_4e8 = (_Base_ptr)0x7ff0000000000000;
      dStack_4e0 = -INFINITY;
      local_568._0_4_ =
           local_2a8.in0.
           super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>.
           _M_impl.super__Vector_impl_data._M_start[lVar22].m_data[0];
      local_568._4_4_ =
           local_2a8.in0.
           super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>.
           _M_impl.super__Vector_impl_data._M_start[lVar22].m_data[1];
      ContainerTraits<tcu::Vector<float,_2>,_tcu::Vector<tcu::Interval,_2>_>::doRound
                ((IVal *)local_548,pFVar21,(Vector<float,_2> *)local_568);
      ContainerTraits<tcu::Vector<float,_2>,_tcu::Vector<tcu::Interval,_2>_>::doConvert
                ((IVal *)local_468,pFVar21,(IVal *)local_548);
      pIVar15 = Environment::lookup<tcu::Vector<float,2>>
                          ((Environment *)&local_2e8,
                           (this->m_variables).in0.
                           super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Vector<float,_2>_>_>
                           .m_ptr);
      pIVar15->m_data[1].m_lo = (double)local_448;
      pIVar15->m_data[1].m_hi = dStack_440;
      pIVar15->m_data[0].m_hi = (double)aStack_458._M_allocated_capacity;
      *(ulong *)(pIVar15->m_data + 1) = CONCAT44(aStack_458._12_4_,aStack_458._8_4_);
      pIVar15->m_data[0].m_hasNaN = local_468;
      pIVar15->m_data[0].m_lo = dStack_460;
      Environment::lookup<vkt::shaderexecutor::Void>
                ((Environment *)&local_2e8,
                 (this->m_variables).in1.
                 super_SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>.
                 m_ptr);
      Environment::lookup<vkt::shaderexecutor::Void>
                ((Environment *)&local_2e8,
                 (this->m_variables).in2.
                 super_SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>.
                 m_ptr);
      Environment::lookup<vkt::shaderexecutor::Void>
                ((Environment *)&local_2e8,
                 (this->m_variables).in3.
                 super_SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>.
                 m_ptr);
      local_448 = (_Base_ptr)pFVar21->m_maxValue;
      local_468 = *(undefined1 (*) [8])pFVar21;
      dStack_460 = *(double *)&pFVar21->m_fractionBits;
      aStack_458._M_allocated_capacity = *(undefined8 *)&pFVar21->m_hasInf;
      aStack_458._8_4_ = *(undefined4 *)&pFVar21->m_exactPrecision;
      aStack_458._12_4_ = *(undefined4 *)&pFVar21->field_0x1c;
      dStack_440 = (double)CONCAT44(dStack_440._4_4_,(this->m_caseCtx).precision);
      local_430 = 0;
      pSVar4 = (this->m_stmt).super_SharedPtr<const_vkt::shaderexecutor::Statement>.m_ptr;
      local_438 = &local_2e8;
      (*pSVar4->_vptr_Statement[3])(pSVar4,(string *)local_468);
      pIVar16 = Environment::lookup<tcu::Vector<int,2>>
                          ((Environment *)&local_2e8,
                           (this->m_variables).out1.
                           super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Vector<int,_2>_>_>
                           .m_ptr);
      ContainerTraits<tcu::Vector<int,_2>,_tcu::Vector<tcu::Interval,_2>_>::doConvert
                ((IVal *)local_468,&local_228,pIVar16);
      local_4e8 = local_448;
      dStack_4e0 = dStack_440;
      aStack_4f8._M_allocated_capacity = aStack_458._M_allocated_capacity;
      aStack_4f8._8_8_ = (_Base_ptr)CONCAT44(aStack_458._12_4_,aStack_458._8_4_);
      local_508 = local_468;
      uStack_500 = dStack_460;
      bVar10 = true;
      lVar19 = 0;
      pcVar18 = local_508;
      do {
        bVar11 = (double)local_498.out1.
                         super__Vector_base<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[lVar22].m_data[lVar19] <=
                 *(double *)(pcVar18 + 0x10) &&
                 *(double *)(pcVar18 + 8) <=
                 (double)local_498.out1.
                         super__Vector_base<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[lVar22].m_data[lVar19];
        if (!bVar10) break;
        lVar19 = 1;
        bVar10 = false;
        pcVar18 = aStack_4f8._M_local_buf + 8;
      } while (bVar11);
      local_468 = (undefined1  [8])&aStack_458;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_468,"Shader output 1 is outside acceptable range","");
      bVar10 = tcu::ResultCollector::check(&local_1f8,bVar11,(string *)local_468);
      if (local_468 != (undefined1  [8])&aStack_458) {
        operator_delete((void *)local_468,(ulong)(aStack_458._M_allocated_capacity + 1));
      }
      pIVar15 = Environment::lookup<tcu::Vector<float,2>>
                          ((Environment *)&local_2e8,
                           (this->m_variables).out0.
                           super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Vector<float,_2>_>_>
                           .m_ptr);
      ContainerTraits<tcu::Vector<float,_2>,_tcu::Vector<tcu::Interval,_2>_>::doConvert
                ((IVal *)local_468,&local_228,pIVar15);
      uStack_190 = CONCAT44(aStack_458._12_4_,aStack_458._8_4_);
      local_188 = local_448;
      dStack_180 = dStack_440;
      local_1a8._16_8_ = aStack_458._M_allocated_capacity;
      local_1a8._0_8_ = local_468;
      local_1a8._8_8_ = dStack_460;
      bVar11 = contains<tcu::Vector<float,2>>
                         ((IVal *)local_1a8,
                          local_498.out0.
                          super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                          ._M_impl.super__Vector_impl_data._M_start + lVar22);
      local_468 = (undefined1  [8])&aStack_458;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_468,"Shader output 0 is outside acceptable range","");
      bVar11 = tcu::ResultCollector::check(&local_1f8,bVar11,(string *)local_468);
      if (local_468 != (undefined1  [8])&aStack_458) {
        operator_delete((void *)local_468,(ulong)(aStack_458._M_allocated_capacity + 1));
      }
      pFVar21 = local_4b0;
      if (!bVar10 || !bVar11) {
        uVar13 = (int)local_4b8 + 1;
        local_4b8 = (ulong)uVar13;
        if ((int)uVar13 < 0x65) {
          local_468 = (undefined1  [8])local_518;
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&dStack_460);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&dStack_460,"Failed",6);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&dStack_460," sample:\n",9);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&dStack_460,"\t",1);
          pVVar6 = (this->m_variables).in0.
                   super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Vector<float,_2>_>_>.
                   m_ptr;
          val = (Vector<float,_2> *)(local_548 + 0x10);
          pcVar7 = (pVVar6->m_name)._M_dataplus._M_p;
          local_548._0_8_ = val;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_548,pcVar7,pcVar7 + (pVVar6->m_name)._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&dStack_460,(char *)local_548._0_8_,local_548._8_8_);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&dStack_460," = ",3);
          valueToString<tcu::Vector<float,2>>
                    ((string *)local_568,(shaderexecutor *)&local_228,
                     (FloatFormat *)
                     (local_2a8.in0.
                      super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                      ._M_impl.super__Vector_impl_data._M_start + lVar22),val);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&dStack_460,(char *)CONCAT44(local_568._4_4_,local_568._0_4_),
                     local_560);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&dStack_460,"\n",1);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)CONCAT44(local_568._4_4_,local_568._0_4_) != &local_558) {
            operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)CONCAT44(local_568._4_4_,local_568._0_4_),
                            local_558._M_allocated_capacity + 1);
          }
          if ((Vector<float,_2> *)local_548._0_8_ != (Vector<float,_2> *)(local_548 + 0x10)) {
            operator_delete((void *)local_548._0_8_,local_548._16_8_ + 1);
          }
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&dStack_460,"\t",1);
          pVVar6 = (this->m_variables).out0.
                   super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Vector<float,_2>_>_>.
                   m_ptr;
          pIVar15 = (IVal *)(local_548 + 0x10);
          pcVar7 = (pVVar6->m_name)._M_dataplus._M_p;
          local_548._0_8_ = pIVar15;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_548,pcVar7,pcVar7 + (pVVar6->m_name)._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&dStack_460,(char *)local_548._0_8_,local_548._8_8_);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&dStack_460," = ",3);
          valueToString<tcu::Vector<float,2>>
                    ((string *)local_568,(shaderexecutor *)&local_228,
                     (FloatFormat *)
                     (local_498.out0.
                      super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                      ._M_impl.super__Vector_impl_data._M_start + lVar22),
                     (Vector<float,_2> *)pIVar15);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&dStack_460,(char *)CONCAT44(local_568._4_4_,local_568._0_4_),
                     local_560);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&dStack_460,"\n",1);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&dStack_460,"\tExpected range: ",0x11);
          intervalToString<tcu::Vector<float,2>>
                    (&local_4d8,(shaderexecutor *)&local_228,(FloatFormat *)local_1a8,pIVar15);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&dStack_460,local_4d8._M_dataplus._M_p,local_4d8._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&dStack_460,"\n",1);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_4d8._M_dataplus._M_p != &local_4d8.field_2) {
            operator_delete(local_4d8._M_dataplus._M_p,local_4d8.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)CONCAT44(local_568._4_4_,local_568._0_4_) != &local_558) {
            operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)CONCAT44(local_568._4_4_,local_568._0_4_),
                            local_558._M_allocated_capacity + 1);
          }
          if ((IVal *)local_548._0_8_ != (IVal *)(local_548 + 0x10)) {
            operator_delete((void *)local_548._0_8_,local_548._16_8_ + 1);
          }
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&dStack_460,"\t",1);
          pVVar8 = (this->m_variables).out1.
                   super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Vector<int,_2>_>_>.m_ptr
          ;
          pIVar16 = (IVal *)(local_548 + 0x10);
          pcVar7 = (pVVar8->m_name)._M_dataplus._M_p;
          local_548._0_8_ = pIVar16;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_548,pcVar7,pcVar7 + (pVVar8->m_name)._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&dStack_460,(char *)local_548._0_8_,local_548._8_8_);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&dStack_460," = ",3);
          valueToString<tcu::Vector<int,2>>
                    ((string *)local_568,(shaderexecutor *)&local_228,
                     (FloatFormat *)
                     (local_498.out1.
                      super__Vector_base<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_>
                      ._M_impl.super__Vector_impl_data._M_start + lVar22),(Vector<int,_2> *)pIVar16)
          ;
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&dStack_460,(char *)CONCAT44(local_568._4_4_,local_568._0_4_),
                     local_560);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&dStack_460,"\n",1);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&dStack_460,"\tExpected range: ",0x11);
          intervalToString<tcu::Vector<int,2>>
                    (&local_4d8,(shaderexecutor *)&local_228,(FloatFormat *)local_508,pIVar16);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&dStack_460,local_4d8._M_dataplus._M_p,local_4d8._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&dStack_460,"\n",1);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_4d8._M_dataplus._M_p != &local_4d8.field_2) {
            operator_delete(local_4d8._M_dataplus._M_p,local_4d8.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)CONCAT44(local_568._4_4_,local_568._0_4_) != &local_558) {
            operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)CONCAT44(local_568._4_4_,local_568._0_4_),
                            local_558._M_allocated_capacity + 1);
          }
          if ((IVal *)local_548._0_8_ != (IVal *)(local_548 + 0x10)) {
            operator_delete((void *)local_548._0_8_,local_548._16_8_ + 1);
          }
          tcu::MessageBuilder::operator<<
                    ((MessageBuilder *)local_468,(EndMessageToken *)&tcu::TestLog::EndMessage);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&dStack_460);
          std::ios_base::~ios_base(local_3f0);
        }
      }
      lVar22 = lVar22 + 1;
    } while (lVar22 != local_4a0);
    iVar12 = (int)local_4b8;
    if (iVar12 < 0x65) {
      if (iVar12 == 0) goto LAB_00999ea0;
    }
    else {
      local_468 = (undefined1  [8])local_518;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&dStack_460);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&dStack_460,"(Skipped ",9);
      std::ostream::operator<<((ostringstream *)&dStack_460,iVar12 + -100);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&dStack_460," messages.)",0xb);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_468,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&dStack_460);
      std::ios_base::~ios_base(local_3f0);
    }
    local_468 = (undefined1  [8])local_518;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&dStack_460);
    std::ostream::operator<<((ostringstream *)&dStack_460,iVar12);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&dStack_460,"/",1);
    std::ostream::_M_insert<unsigned_long>((ulong)&dStack_460);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&dStack_460," inputs failed.",0xf)
    ;
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_468,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&dStack_460);
    std::ios_base::~ios_base(local_3f0);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_468);
    std::ostream::operator<<(local_468,iVar12);
    pTVar23 = local_4a8;
    std::__cxx11::stringbuf::str();
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_468);
    std::ios_base::~ios_base(local_3f8);
    local_468 = (undefined1  [8])&aStack_458;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_468," test failed. Check log for the details","");
    uVar14 = (_Base_ptr)0xf;
    if (local_508 != (undefined1  [8])&aStack_4f8) {
      uVar14 = aStack_4f8._M_allocated_capacity;
    }
    if ((ulong)uVar14 < (_Base_ptr)((long)dStack_460 + (long)uStack_500)) {
      uVar14 = (_Base_ptr)0xf;
      if (local_468 != (undefined1  [8])&aStack_458) {
        uVar14 = aStack_458._M_allocated_capacity;
      }
      if ((ulong)uVar14 < (_Base_ptr)((long)dStack_460 + (long)uStack_500)) goto LAB_00999e91;
      puVar17 = (undefined8 *)
                std::__cxx11::string::replace((ulong)local_468,0,(char *)0x0,(ulong)local_508);
    }
    else {
LAB_00999e91:
      puVar17 = (undefined8 *)std::__cxx11::string::_M_append(local_508,(ulong)local_468);
    }
    local_1a8._0_8_ = local_1a8 + 0x10;
    paVar1 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)(puVar17 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar17 == paVar1) {
      local_1a8._16_8_ = paVar1->_M_allocated_capacity;
      uStack_190 = puVar17[3];
    }
    else {
      local_1a8._16_8_ = paVar1->_M_allocated_capacity;
      local_1a8._0_8_ =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)*puVar17;
    }
    local_1a8._8_8_ = puVar17[1];
    *puVar17 = paVar1;
    puVar17[1] = 0;
    paVar1->_M_local_buf[0] = '\0';
    pTVar23->m_code = QP_TEST_RESULT_FAIL;
    (pTVar23->m_description)._M_dataplus._M_p = (pointer)&(pTVar23->m_description).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&pTVar23->m_description,local_1a8._0_8_,
               (undefined1 *)(local_1a8._0_8_ + local_1a8._8_8_));
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1a8._0_8_ !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)(local_1a8 + 0x10)) {
      operator_delete((void *)local_1a8._0_8_,(ulong)((long)(_Rb_tree_color *)local_1a8._16_8_ + 1))
      ;
    }
    if (local_468 != (undefined1  [8])&aStack_458) {
      operator_delete((void *)local_468,(ulong)(aStack_458._M_allocated_capacity + 1));
    }
    uVar14 = aStack_4f8._M_allocated_capacity;
    auVar20 = local_508;
    if (local_508 == (undefined1  [8])&aStack_4f8) goto LAB_0099a087;
  }
  operator_delete((void *)auVar20,(ulong)((long)&((_Base_ptr)uVar14)->_M_color + 1));
LAB_0099a087:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f8.m_message._M_dataplus._M_p != &local_1f8.m_message.field_2) {
    operator_delete(local_1f8.m_message._M_dataplus._M_p,
                    local_1f8.m_message.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f8.m_prefix._M_dataplus._M_p != &local_1f8.m_prefix.field_2) {
    operator_delete(local_1f8.m_prefix._M_dataplus._M_p,
                    local_1f8.m_prefix.field_2._M_allocated_capacity + 1);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>_>
  ::~_Rb_tree(&local_2e8);
  if (local_498.out1.super__Vector_base<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_498.out1.
                    super__Vector_base<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_498.out1.
                          super__Vector_base<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_498.out1.
                          super__Vector_base<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_498.out0.
      super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_498.out0.
                    super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_498.out0.
                          super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_498.out0.
                          super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_2a8.in3.
      super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_2a8.in3.
                    super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_2a8.in3.
                          super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_2a8.in3.
                          super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_2a8.in2.
      super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_2a8.in2.
                    super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_2a8.in2.
                          super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_2a8.in2.
                          super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_2a8.in1.
      super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_2a8.in1.
                    super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_2a8.in1.
                          super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_2a8.in1.
                          super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_2a8.in0.
      super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_2a8.in0.
                    super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_2a8.in0.
                          super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_2a8.in0.
                          super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return pTVar23;
}

Assistant:

tcu::TestStatus BuiltinPrecisionCaseTestInstance<In, Out>::iterate (void)
{
	typedef typename	In::In0		In0;
	typedef typename	In::In1		In1;
	typedef typename	In::In2		In2;
	typedef typename	In::In3		In3;
	typedef typename	Out::Out0	Out0;
	typedef typename	Out::Out1	Out1;

	Inputs<In>			inputs		= generateInputs(m_samplings, m_caseCtx.floatFormat, m_caseCtx.precision, m_caseCtx.numRandoms, 0xdeadbeefu + m_caseCtx.testContext.getCommandLine().getBaseSeed());
	const FloatFormat&	fmt			= m_caseCtx.floatFormat;
	const int			inCount		= numInputs<In>();
	const int			outCount	= numOutputs<Out>();
	const size_t		numValues	= (inCount > 0) ? inputs.in0.size() : 1;
	Outputs<Out>		outputs		(numValues);
	const FloatFormat	highpFmt	= m_caseCtx.highpFormat;
	const int			maxMsgs		= 100;
	int					numErrors	= 0;
	Environment			env;		// Hoisted out of the inner loop for optimization.
	ResultCollector		status;
	TestLog&			testLog		= m_context.getTestContext().getLog();

	const void*			inputArr[]	=
	{
		&inputs.in0.front(), &inputs.in1.front(), &inputs.in2.front(), &inputs.in3.front(),
	};
	void*				outputArr[]	=
	{
		&outputs.out0.front(), &outputs.out1.front(),
	};

	// Print out the statement and its definitions
	testLog << TestLog::Message << "Statement: " << m_stmt << TestLog::EndMessage;
	{
		ostringstream	oss;
		FuncSet			funcs;

		m_stmt->getUsedFuncs(funcs);
		for (FuncSet::const_iterator it = funcs.begin(); it != funcs.end(); ++it)
		{
			(*it)->printDefinition(oss);
		}
		if (!funcs.empty())
			testLog << TestLog::Message << "Reference definitions:\n" << oss.str()
				  << TestLog::EndMessage;
	}

	switch (inCount)
	{
		case 4: DE_ASSERT(inputs.in3.size() == numValues);
		case 3: DE_ASSERT(inputs.in2.size() == numValues);
		case 2: DE_ASSERT(inputs.in1.size() == numValues);
		case 1: DE_ASSERT(inputs.in0.size() == numValues);
		default: break;
	}

	m_executor->execute(int(numValues), inputArr, outputArr);

	// Initialize environment with dummy values so we don't need to bind in inner loop.
	{
		const typename Traits<In0>::IVal		in0;
		const typename Traits<In1>::IVal		in1;
		const typename Traits<In2>::IVal		in2;
		const typename Traits<In3>::IVal		in3;
		const typename Traits<Out0>::IVal		reference0;
		const typename Traits<Out1>::IVal		reference1;

		env.bind(*m_variables.in0, in0);
		env.bind(*m_variables.in1, in1);
		env.bind(*m_variables.in2, in2);
		env.bind(*m_variables.in3, in3);
		env.bind(*m_variables.out0, reference0);
		env.bind(*m_variables.out1, reference1);
	}

	// For each input tuple, compute output reference interval and compare
	// shader output to the reference.
	for (size_t valueNdx = 0; valueNdx < numValues; valueNdx++)
	{
		bool						result		= true;
		typename Traits<Out0>::IVal	reference0;
		typename Traits<Out1>::IVal	reference1;

		env.lookup(*m_variables.in0) = convert<In0>(fmt, round(fmt, inputs.in0[valueNdx]));
		env.lookup(*m_variables.in1) = convert<In1>(fmt, round(fmt, inputs.in1[valueNdx]));
		env.lookup(*m_variables.in2) = convert<In2>(fmt, round(fmt, inputs.in2[valueNdx]));
		env.lookup(*m_variables.in3) = convert<In3>(fmt, round(fmt, inputs.in3[valueNdx]));

		{
			EvalContext	ctx (fmt, m_caseCtx.precision, env);
			m_stmt->execute(ctx);
		}

		switch (outCount)
		{
			case 2:
				reference1 = convert<Out1>(highpFmt, env.lookup(*m_variables.out1));
				if (!status.check(contains(reference1, outputs.out1[valueNdx]),
									"Shader output 1 is outside acceptable range"))
					result = false;
			case 1:
				reference0 = convert<Out0>(highpFmt, env.lookup(*m_variables.out0));
				if (!status.check(contains(reference0, outputs.out0[valueNdx]),
									"Shader output 0 is outside acceptable range"))
					result = false;
			default: break;
		}

		if (!result)
			++numErrors;

		if ((!result && numErrors <= maxMsgs) || GLS_LOG_ALL_RESULTS)
		{
			MessageBuilder	builder	= testLog.message();

			builder << (result ? "Passed" : "Failed") << " sample:\n";

			if (inCount > 0)
			{
				builder << "\t" << m_variables.in0->getName() << " = "
						<< valueToString(highpFmt, inputs.in0[valueNdx]) << "\n";
			}

			if (inCount > 1)
			{
				builder << "\t" << m_variables.in1->getName() << " = "
						<< valueToString(highpFmt, inputs.in1[valueNdx]) << "\n";
			}

			if (inCount > 2)
			{
				builder << "\t" << m_variables.in2->getName() << " = "
						<< valueToString(highpFmt, inputs.in2[valueNdx]) << "\n";
			}

			if (inCount > 3)
			{
				builder << "\t" << m_variables.in3->getName() << " = "
						<< valueToString(highpFmt, inputs.in3[valueNdx]) << "\n";
			}

			if (outCount > 0)
			{
				builder << "\t" << m_variables.out0->getName() << " = "
						<< valueToString(highpFmt, outputs.out0[valueNdx]) << "\n"
						<< "\tExpected range: "
						<< intervalToString<typename Out::Out0>(highpFmt, reference0) << "\n";
			}

			if (outCount > 1)
			{
				builder << "\t" << m_variables.out1->getName() << " = "
						<< valueToString(highpFmt, outputs.out1[valueNdx]) << "\n"
						<< "\tExpected range: "
						<< intervalToString<typename Out::Out1>(highpFmt, reference1) << "\n";
			}

			builder << TestLog::EndMessage;
		}
	}

	if (numErrors > maxMsgs)
	{
		testLog << TestLog::Message << "(Skipped " << (numErrors - maxMsgs) << " messages.)"
			  << TestLog::EndMessage;
	}

	if (numErrors == 0)
	{
		testLog << TestLog::Message << "All " << numValues << " inputs passed."
			  << TestLog::EndMessage;
	}
	else
	{
		testLog << TestLog::Message << numErrors << "/" << numValues << " inputs failed."
			  << TestLog::EndMessage;
	}

	if (numErrors)
		return tcu::TestStatus::fail(de::toString(numErrors) + string(" test failed. Check log for the details"));
	else
		return tcu::TestStatus::pass("Pass");

}